

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.hpp
# Opt level: O0

void __thiscall Amiga::MemoryMap::set_overlay(MemoryMap *this,bool enabled)

{
  size_type sVar1;
  uchar *base;
  pointer base_00;
  bool enabled_local;
  MemoryMap *this_local;
  
  if ((bool)(this->overlay_ & 1U) != enabled) {
    this->overlay_ = enabled;
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->chip_ram);
    base = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->chip_ram);
    set_region(this,0,(uint32_t)sVar1,base,0x18);
    if (enabled) {
      base_00 = std::array<unsigned_char,_524288UL>::data(&this->kickstart);
      set_region(this,0,0x80000,base_00,8);
    }
  }
  return;
}

Assistant:

void set_overlay(bool enabled) {
			if(overlay_ == enabled) {
				return;
			}
			overlay_ = enabled;

			set_region(0x00'0000, uint32_t(chip_ram.size()), chip_ram.data(), PermitReadWrite);
			if(enabled) {
				set_region(0x00'0000, 0x08'0000, kickstart.data(), PermitRead);
			}
		}